

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool __thiscall
ON_ModelComponent::ChangeName
          (ON_ModelComponent *this,wchar_t *new_name,ON_ComponentManifest *manifest)

{
  Type component_type;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ON_ComponentManifestItem *pOVar4;
  wchar_t *name;
  byte bVar5;
  char *sFormat;
  uint uVar6;
  int line_number;
  ON_UUID *pOVar7;
  ON_wString local_name;
  ON_UUID name_parent_id;
  ON_NameHash new_name_hash;
  ON_wString local_70;
  ON_UUID local_68;
  ON_NameHash local_58;
  
  component_type = this->m_component_type;
  uVar3 = (uint)component_type;
  if (manifest != (ON_ComponentManifest *)0x0) {
    pOVar4 = ON_ComponentManifest::ItemFromId(manifest,component_type,this->m_component_id);
    bVar1 = ON_ComponentManifestItem::IsUnset(pOVar4);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x540,"","component is not in the manifest.");
      return false;
    }
  }
  bVar5 = (byte)(component_type - 1);
  if ((bVar5 < 0x11) && ((0x17fffU >> (component_type - 1 & 0x1f) & 1) != 0)) {
    uVar6 = 0x1c6f8 >> (bVar5 & 0x1f);
  }
  else {
    uVar6 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x807,"","Invalid component_type parameter.");
  }
  ON_wString::ON_wString(&local_70,new_name);
  ON_wString::TrimLeftAndRight(&local_70,(wchar_t *)0x0);
  name = ON_wString::operator_cast_to_wchar_t_(&local_70);
  pOVar7 = &ON_nil_uuid;
  if (uVar3 < 0x12) {
    if ((0x2ffdeU >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 != 5) goto LAB_005334e5;
      pOVar7 = &this->m_component_parent_id;
    }
  }
  else {
LAB_005334e5:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x7e5,"","Invalid component_type parameter.");
  }
  local_68.Data1 = pOVar7->Data1;
  local_68.Data2 = pOVar7->Data2;
  local_68.Data3 = pOVar7->Data3;
  local_68.Data4 = *&pOVar7->Data4;
  ON_NameHash::Create(&local_58,&local_68,name);
  bVar1 = ON_wString::IsEmpty(&local_70);
  if (bVar1) {
    if ((uVar6 & 1) == 0) {
LAB_0053340c:
      if (manifest != (ON_ComponentManifest *)0x0) goto LAB_00533411;
LAB_0053347a:
      bVar1 = ON_wString::IsEmpty(&local_70);
      if (bVar1) {
        uVar3 = ClearModelComponentAttributes(this,0xa0);
        bVar1 = true;
        if (uVar3 == 0xa0) goto LAB_0053345f;
      }
      else {
        bVar2 = SetName(this,name);
        bVar1 = true;
        if (bVar2) goto LAB_0053345f;
      }
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x574,"","Unable to change component name.");
      goto LAB_0053345f;
    }
    sFormat = "This component cannot have an empty name.";
    line_number = 0x552;
  }
  else {
    bVar1 = IsValidComponentName(name);
    if (bVar1) {
      sFormat = "Invalid component name.";
      line_number = 0x558;
    }
    else {
      if ((~(byte)uVar6 & 1) != 0 || manifest == (ON_ComponentManifest *)0x0) goto LAB_0053340c;
      pOVar4 = ON_ComponentManifest::ItemFromNameHash(manifest,component_type,&local_58);
      bVar1 = ON_ComponentManifestItem::IsValid(pOVar4);
      if (bVar1) {
        bVar1 = false;
        goto LAB_0053345f;
      }
LAB_00533411:
      pOVar4 = ON_ComponentManifest::ChangeComponentName
                         (manifest,this->m_component_id,component_type,this->m_component_parent_id,
                          name);
      bVar1 = ON_ComponentManifestItem::IsUnset(pOVar4);
      if (!bVar1) goto LAB_0053347a;
      sFormat = "Unable to update manifest.";
      line_number = 0x569;
    }
  }
  bVar1 = false;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,line_number,"",sFormat);
LAB_0053345f:
  ON_wString::~ON_wString(&local_70);
  return bVar1;
}

Assistant:

bool ON_ModelComponent::ChangeName(
  const wchar_t* new_name,
  class ON_ComponentManifest* manifest
)
{
  const ON_ModelComponent::Type component_type = ComponentType();

  if (nullptr != manifest)
  {
    if (manifest->ItemFromId(component_type, Id()).IsUnset())
    {
      ON_ERROR("component is not in the manifest.");
      return false;
    }
  }

  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(component_type);
  ON_wString local_name(new_name);
  local_name.TrimLeftAndRight();
  new_name = local_name;
  const ON_UUID name_parent_id
    = ON_ModelComponent::UniqueNameIncludesParent(component_type)
    ? ParentId()
    : ON_nil_uuid;
  const ON_NameHash new_name_hash = ON_NameHash::Create(name_parent_id,new_name);
  if (local_name.IsEmpty() )
  {
    if (bUniqueNameRequired)
    {
      ON_ERROR("This component cannot have an empty name.");
      return false;
    }
  }
  else if (ON_ModelComponent::IsValidComponentName(new_name))
  {
    ON_ERROR("Invalid component name.");
    return false;
  }
  else if (bUniqueNameRequired && nullptr != manifest )
  {
    if (manifest->ItemFromNameHash(component_type, new_name_hash).IsValid())
    {
      // name is already being used.
      return false;
    }
  }

  if ( 
    nullptr != manifest
    && manifest->ChangeComponentName(Id(), component_type, ParentId(), new_name).IsUnset() 
    )
  {
    ON_ERROR("Unable to update manifest.");
    return false;
  }

  const bool rc
    = (local_name.IsEmpty())
    ? ClearName()
    : SetName(new_name);

  if (false == rc)
  {
    ON_ERROR("Unable to change component name.");
    return false;
  }

  return true;
}